

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void create_file_names(void)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  size_t __size;
  
  pcVar1 = getenv("TMPDIR");
  pcVar3 = "/tmp";
  if (pcVar1 != (char *)0x0) {
    pcVar3 = pcVar1;
  }
  sVar2 = strlen(pcVar3);
  iVar5 = (int)sVar2;
  if (iVar5 == 0) {
    __size = 0xd;
  }
  else {
    __size = (size_t)((iVar5 - (uint)(pcVar3[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] == '/')
                      ) + 0xe);
  }
  action_file_name = (char *)malloc(__size);
  if (action_file_name == (char *)0x0) {
    no_space();
  }
  text_file_name = (char *)malloc(__size);
  if (text_file_name == (char *)0x0) {
    no_space();
  }
  union_file_name = (char *)malloc(__size);
  if (union_file_name == (char *)0x0) {
    no_space();
  }
  strcpy(action_file_name,pcVar3);
  strcpy(text_file_name,pcVar3);
  strcpy(union_file_name,pcVar3);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else if (pcVar3[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] != '/') {
    lVar4 = (long)(sVar2 << 0x20) >> 0x20;
    action_file_name[lVar4] = '/';
    text_file_name[lVar4] = '/';
    union_file_name[lVar4] = '/';
    iVar5 = iVar5 + 1;
  }
  lVar4 = (long)iVar5;
  strcpy(action_file_name + lVar4,temp_form);
  strcpy(text_file_name + lVar4,temp_form);
  strcpy(union_file_name + lVar4,temp_form);
  action_file_name[lVar4 + 5] = 'a';
  text_file_name[lVar4 + 5] = 't';
  union_file_name[lVar4 + 5] = 'u';
  pcVar3 = mktemp(action_file_name);
  if (pcVar3 == (char *)0x0) {
    create_file_names_cold_3();
  }
  else {
    pcVar3 = mktemp(text_file_name);
    if (pcVar3 != (char *)0x0) {
      pcVar1 = mktemp(union_file_name);
      pcVar3 = file_prefix;
      if (pcVar1 != (char *)0x0) {
        sVar2 = strlen(file_prefix);
        iVar5 = (int)sVar2;
        output_file_name = (char *)malloc((ulong)(iVar5 + 7));
        if (output_file_name == (char *)0x0) {
          no_space();
          pcVar3 = file_prefix;
        }
        strcpy(output_file_name,pcVar3);
        pcVar3 = output_file_name;
        builtin_strncpy(output_file_name + iVar5,".tab",4);
        builtin_strncpy(pcVar3 + (long)iVar5 + 3,"b.c",4);
        if (rflag == '\0') {
          code_file_name = output_file_name;
        }
        else {
          code_file_name = (char *)malloc((ulong)(iVar5 + 8));
          if (code_file_name == (char *)0x0) {
            no_space();
          }
          strcpy(code_file_name,file_prefix);
          builtin_strncpy(code_file_name + iVar5,".code.c",8);
        }
        if (dflag != '\0') {
          defines_file_name = (char *)malloc((ulong)(iVar5 + 7));
          if (defines_file_name == (char *)0x0) {
            no_space();
          }
          strcpy(defines_file_name,file_prefix);
          pcVar3 = defines_file_name;
          builtin_strncpy(defines_file_name + iVar5,".tab",4);
          builtin_strncpy(pcVar3 + (long)iVar5 + 3,"b.h",4);
        }
        if (ebnfflag != '\0') {
          ebnf_file_name = (char *)malloc((ulong)(iVar5 + 8));
          if (ebnf_file_name == (char *)0x0) {
            no_space();
          }
          strcpy(ebnf_file_name,file_prefix);
          pcVar3 = ebnf_file_name;
          builtin_strncpy(ebnf_file_name + iVar5,".ebn",4);
          (pcVar3 + (long)iVar5 + 4)[0] = 'f';
          (pcVar3 + (long)iVar5 + 4)[1] = '\0';
        }
        if (vflag != '\0') {
          verbose_file_name = (char *)malloc((ulong)(iVar5 + 8));
          if (verbose_file_name == (char *)0x0) {
            no_space();
          }
          strcpy(verbose_file_name,file_prefix);
          builtin_strncpy(verbose_file_name + iVar5,".output",8);
        }
        return;
      }
      goto LAB_0010eeaf;
    }
  }
  create_file_names_cold_2();
LAB_0010eeaf:
  create_file_names_cold_1();
  create_file_names();
  action_file = (FILE *)fopen(action_file_name,"w");
  if ((FILE *)action_file == (FILE *)0x0) {
    open_error(action_file_name);
  }
  text_file = (FILE *)fopen(text_file_name,"w");
  if ((FILE *)text_file == (FILE *)0x0) {
    open_error(text_file_name);
  }
  if (vflag != '\0') {
    verbose_file = (FILE *)fopen(verbose_file_name,"w");
    if ((FILE *)verbose_file == (FILE *)0x0) {
      open_error(verbose_file_name);
    }
  }
  if (ebnfflag != '\0') {
    ebnf_file = (FILE *)fopen(ebnf_file_name,"w");
    if ((FILE *)ebnf_file == (FILE *)0x0) {
      open_error(ebnf_file_name);
    }
  }
  if (dflag != '\0') {
    defines_file = (FILE *)fopen(defines_file_name,"w");
    if ((FILE *)defines_file == (FILE *)0x0) {
      open_error(defines_file_name);
    }
    union_file = (FILE *)fopen(union_file_name,"w");
    if ((FILE *)union_file == (FILE *)0x0) {
      open_error(union_file_name);
    }
  }
  output_file = (FILE *)fopen(output_file_name,"w");
  if ((FILE *)output_file == (FILE *)0x0) {
    open_error(output_file_name);
  }
  if (rflag == '\0') {
    code_file = output_file;
  }
  else {
    code_file = (FILE *)fopen(code_file_name,"w");
    if ((FILE *)code_file == (FILE *)0x0) {
      open_error(code_file_name);
      return;
    }
  }
  return;
}

Assistant:

void create_file_names()
{
    int i, len;
    char *tmpdir;

    tmpdir = getenv("TMPDIR");
    if (tmpdir == 0) tmpdir = DEFAULT_TMPDIR;

    len = strlen(tmpdir);
    i = len + 13;
    if (len && tmpdir[len-1] != DIR_CHAR)
	++i;

    action_file_name = MALLOC(i);
    if (action_file_name == 0) no_space();
    text_file_name = MALLOC(i);
    if (text_file_name == 0) no_space();
    union_file_name = MALLOC(i);
    if (union_file_name == 0) no_space();

    strcpy(action_file_name, tmpdir);
    strcpy(text_file_name, tmpdir);
    strcpy(union_file_name, tmpdir);

    if (len && tmpdir[len - 1] != DIR_CHAR)
    {
	action_file_name[len] = DIR_CHAR;
	text_file_name[len] = DIR_CHAR;
	union_file_name[len] = DIR_CHAR;
	++len;
    }

    strcpy(action_file_name + len, temp_form);
    strcpy(text_file_name + len, temp_form);
    strcpy(union_file_name + len, temp_form);

    action_file_name[len + 5] = 'a';
    text_file_name[len + 5] = 't';
    union_file_name[len + 5] = 'u';

    if(mktemp(action_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }
    if(mktemp(text_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }
    if(mktemp(union_file_name)==NULL) {
      fprintf(stderr, "btyacc: Cannot create temporary file\n");
      exit(1);
    }

    len = strlen(file_prefix);

    output_file_name = MALLOC(len + 7);
    if (output_file_name == 0)
	no_space();
    strcpy(output_file_name, file_prefix);
    strcpy(output_file_name + len, OUTPUT_SUFFIX);

    if (rflag)
    {
	code_file_name = MALLOC(len + 8);
	if (code_file_name == 0)
	    no_space();
	strcpy(code_file_name, file_prefix);
	strcpy(code_file_name + len, CODE_SUFFIX);
    }
    else
	code_file_name = output_file_name;

    if (dflag)
    {
	defines_file_name = MALLOC(len + 7);
	if (defines_file_name == 0)
	    no_space();
	strcpy(defines_file_name, file_prefix);
	strcpy(defines_file_name + len, DEFINES_SUFFIX);
    }

    if (ebnfflag)
    {
	ebnf_file_name = MALLOC(len + 8);
	if (ebnf_file_name == 0)
	    no_space();
	strcpy(ebnf_file_name, file_prefix);
	strcpy(ebnf_file_name + len, EBNF_SUFFIX);
    }

    if (vflag)
    {
	verbose_file_name = MALLOC(len + 8);
	if (verbose_file_name == 0)
	    no_space();
	strcpy(verbose_file_name, file_prefix);
	strcpy(verbose_file_name + len, VERBOSE_SUFFIX);
    }
}